

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2UnicodeClasses(void)

{
  bool bVar1;
  string str;
  string c;
  string b;
  string a;
  StringPiece local_248;
  LogMessageFatal local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  char *local_a0;
  int local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_a0,anon_var_dwarf_15938,(allocator *)&local_238);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_60.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_248.ptr_ = "A";
  local_248.length_ = 1;
  RE2::RE2((RE2 *)&local_238,"\\p{L}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x551);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"A\", \"\\\\p{L}\")");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = "A";
  local_248.length_ = 1;
  RE2::RE2((RE2 *)&local_238,"\\p{Lu}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x552);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"A\", \"\\\\p{Lu}\")");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = "A";
  local_248.length_ = 1;
  RE2::RE2((RE2 *)&local_238,"\\p{Ll}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x553);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: !(RE2::FullMatch(\"A\", \"\\\\p{Ll}\"))");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = "A";
  local_248.length_ = 1;
  RE2::RE2((RE2 *)&local_238,"\\P{L}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x554);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: !(RE2::FullMatch(\"A\", \"\\\\P{L}\"))");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = "A";
  local_248.length_ = 1;
  RE2::RE2((RE2 *)&local_238,"\\P{Lu}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x555);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: !(RE2::FullMatch(\"A\", \"\\\\P{Lu}\"))");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = "A";
  local_248.length_ = 1;
  RE2::RE2((RE2 *)&local_238,"\\P{Ll}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x556);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"A\", \"\\\\P{Ll}\")");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_159d4;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\p{L}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x558);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_159e0);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_159d4;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\p{Lu}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x559);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_159ec);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_159d4;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\p{Ll}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55a);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_159f8);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_159d4;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\P{L}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55b);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a04);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_159d4;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\P{Lu}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55c);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a10);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_159d4;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\P{Ll}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55d);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a1c);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15a28;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\p{L}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x55f);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a34);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15a28;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\p{Lu}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x560);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a40);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15a28;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\p{Ll}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x561);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a4c);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15a28;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\P{L}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x562);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a58);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15a28;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\P{Lu}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x563);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a64);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15a28;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\P{Ll}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x564);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a70);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15938 + 0xf;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\p{L}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x566);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a88);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15938 + 0xf;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\p{Lu}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x567);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15a94);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15938 + 0xf;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\p{Ll}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x568);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15aa0);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15938 + 0xf;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\P{L}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x569);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15aac);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15938 + 0xf;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\P{Lu}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56a);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15ab8);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = anon_var_dwarf_15938 + 0xf;
  local_248.length_ = 3;
  RE2::RE2((RE2 *)&local_238,"\\P{Ll}");
  bVar1 = RE2::FullMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56b);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15ac4);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = local_a0;
  local_248.length_ = local_98;
  RE2::RE2((RE2 *)&local_238,"(.).*?(.).*?(.)");
  local_a8 = &local_40;
  local_b0 = &local_60;
  local_b8 = &local_80;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_248,(RE2 *)&local_238,&local_a8,&local_b0,&local_b8);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56d);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(str, \"(.).*?(.).*?(.)\", &a, &b, &c)");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==("A",&local_40);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56e);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,"Check failed: (\"A\") == (a)");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==("B",&local_60);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x56f);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,"Check failed: (\"B\") == (b)");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==("C",&local_80);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x570);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,"Check failed: (\"C\") == (c)");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = local_a0;
  local_248.length_ = local_98;
  RE2::RE2((RE2 *)&local_238,"(.).*?([\\p{L}]).*?(.)");
  local_b8 = &local_80;
  local_b0 = &local_60;
  local_a8 = &local_40;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_248,(RE2 *)&local_238,&local_a8,&local_b0,&local_b8);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x572);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(str, \"(.).*?([\\\\p{L}]).*?(.)\", &a, &b, &c)"
                   );
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==("A",&local_40);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x573);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,"Check failed: (\"A\") == (a)");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==("B",&local_60);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x574);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,"Check failed: (\"B\") == (b)");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==("C",&local_80);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x575);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,"Check failed: (\"C\") == (c)");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = local_a0;
  local_248.length_ = local_98;
  RE2::RE2((RE2 *)&local_238,"\\P{L}");
  bVar1 = RE2::PartialMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x577);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: !(RE2::PartialMatch(str, \"\\\\P{L}\"))");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = local_a0;
  local_248.length_ = local_98;
  RE2::RE2((RE2 *)&local_238,"(.).*?([\\p{Lu}]).*?(.)");
  local_b8 = &local_80;
  local_b0 = &local_60;
  local_a8 = &local_40;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_248,(RE2 *)&local_238,&local_a8,&local_b0,&local_b8);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x579);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(str, \"(.).*?([\\\\p{Lu}]).*?(.)\", &a, &b, &c)"
                   );
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==("A",&local_40);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57a);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,"Check failed: (\"A\") == (a)");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==("B",&local_60);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57b);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,"Check failed: (\"B\") == (b)");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==("C",&local_80);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57c);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,"Check failed: (\"C\") == (c)");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = local_a0;
  local_248.length_ = local_98;
  RE2::RE2((RE2 *)&local_238,"[^\\p{Lu}\\p{Lo}]");
  bVar1 = RE2::PartialMatch<>(&local_248,(RE2 *)&local_238);
  RE2::~RE2((RE2 *)&local_238);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x57e);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: !(RE2::PartialMatch(str, \"[^\\\\p{Lu}\\\\p{Lo}]\"))");
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  local_248.ptr_ = local_a0;
  local_248.length_ = local_98;
  RE2::RE2((RE2 *)&local_238,".*(.).*?([\\p{Lu}\\p{Lo}]).*?(.)");
  local_b8 = &local_80;
  local_b0 = &local_60;
  local_a8 = &local_40;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_248,(RE2 *)&local_238,&local_a8,&local_b0,&local_b8);
  RE2::~RE2((RE2 *)&local_238);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x580);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(str, \".*(.).*?([\\\\p{Lu}\\\\p{Lo}]).*?(.)\", &a, &b, &c)"
                   );
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==(anon_var_dwarf_159d4,&local_40);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x581);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15b78);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==(anon_var_dwarf_15a28,&local_60);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x582);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15b84);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  bVar1 = std::operator==(anon_var_dwarf_15938 + 0xf,&local_80);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x583);
    std::operator<<((ostream *)&local_238.super_LogMessage.str_,anon_var_dwarf_15b90);
    LogMessageFatal::~LogMessageFatal(&local_238);
  }
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

TEST(RE2, UnicodeClasses) {
  const string str = "ABCDEFGHI譚永鋒";
  string a, b, c;

  EXPECT_TRUE(RE2::FullMatch("A", "\\p{L}"));
  EXPECT_TRUE(RE2::FullMatch("A", "\\p{Lu}"));
  EXPECT_FALSE(RE2::FullMatch("A", "\\p{Ll}"));
  EXPECT_FALSE(RE2::FullMatch("A", "\\P{L}"));
  EXPECT_FALSE(RE2::FullMatch("A", "\\P{Lu}"));
  EXPECT_TRUE(RE2::FullMatch("A", "\\P{Ll}"));

  EXPECT_TRUE(RE2::FullMatch("譚", "\\p{L}"));
  EXPECT_FALSE(RE2::FullMatch("譚", "\\p{Lu}"));
  EXPECT_FALSE(RE2::FullMatch("譚", "\\p{Ll}"));
  EXPECT_FALSE(RE2::FullMatch("譚", "\\P{L}"));
  EXPECT_TRUE(RE2::FullMatch("譚", "\\P{Lu}"));
  EXPECT_TRUE(RE2::FullMatch("譚", "\\P{Ll}"));

  EXPECT_TRUE(RE2::FullMatch("永", "\\p{L}"));
  EXPECT_FALSE(RE2::FullMatch("永", "\\p{Lu}"));
  EXPECT_FALSE(RE2::FullMatch("永", "\\p{Ll}"));
  EXPECT_FALSE(RE2::FullMatch("永", "\\P{L}"));
  EXPECT_TRUE(RE2::FullMatch("永", "\\P{Lu}"));
  EXPECT_TRUE(RE2::FullMatch("永", "\\P{Ll}"));

  EXPECT_TRUE(RE2::FullMatch("鋒", "\\p{L}"));
  EXPECT_FALSE(RE2::FullMatch("鋒", "\\p{Lu}"));
  EXPECT_FALSE(RE2::FullMatch("鋒", "\\p{Ll}"));
  EXPECT_FALSE(RE2::FullMatch("鋒", "\\P{L}"));
  EXPECT_TRUE(RE2::FullMatch("鋒", "\\P{Lu}"));
  EXPECT_TRUE(RE2::FullMatch("鋒", "\\P{Ll}"));

  EXPECT_TRUE(RE2::PartialMatch(str, "(.).*?(.).*?(.)", &a, &b, &c));
  EXPECT_EQ("A", a);
  EXPECT_EQ("B", b);
  EXPECT_EQ("C", c);

  EXPECT_TRUE(RE2::PartialMatch(str, "(.).*?([\\p{L}]).*?(.)", &a, &b, &c));
  EXPECT_EQ("A", a);
  EXPECT_EQ("B", b);
  EXPECT_EQ("C", c);

  EXPECT_FALSE(RE2::PartialMatch(str, "\\P{L}"));

  EXPECT_TRUE(RE2::PartialMatch(str, "(.).*?([\\p{Lu}]).*?(.)", &a, &b, &c));
  EXPECT_EQ("A", a);
  EXPECT_EQ("B", b);
  EXPECT_EQ("C", c);

  EXPECT_FALSE(RE2::PartialMatch(str, "[^\\p{Lu}\\p{Lo}]"));

  EXPECT_TRUE(RE2::PartialMatch(str, ".*(.).*?([\\p{Lu}\\p{Lo}]).*?(.)", &a, &b, &c));
  EXPECT_EQ("譚", a);
  EXPECT_EQ("永", b);
  EXPECT_EQ("鋒", c);
}